

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting_list.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  istream *piVar2;
  ostream *poVar3;
  size_t b;
  ulong uVar4;
  double dVar5;
  int Ly;
  int Lx;
  double local_140;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  double t_step;
  double t_max;
  double t_min;
  span_t local_e0;
  basis local_c8;
  graph lat;
  unitcell local_60;
  
  inter.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  inter.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inter.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  field.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  field.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  field.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&Lx);
  std::istream::operator>>(piVar2,&Ly);
  lattice::basis::simple(&local_c8,2);
  lattice::unitcell::simple(&local_60,2);
  lattice::extent(&local_e0,(long)Lx,(long)Ly);
  lattice::graph::graph(&lat,&local_c8,&local_60,&local_e0,periodic);
  free(local_e0.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  lattice::unitcell::~unitcell(&local_60);
  free(local_c8.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  std::vector<double,_std::allocator<double>_>::resize
            (&inter,((long)lat.bonds_.
                           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)lat.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)lat.bonds_.
                             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)lat.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    std::istream::_M_extract<double>((double *)&std::cin);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&field,((long)lat.sites_.
                           super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)lat.sites_.
                          super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)lat.sites_.
                             super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)lat.sites_.
                            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar4 = uVar4 + 1) {
    std::istream::_M_extract<double>((double *)&std::cin);
  }
  piVar2 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar2 = std::istream::_M_extract<double>((double *)piVar2);
  std::istream::_M_extract<double>((double *)piVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"# Lx = ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,Lx);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"# Ly = ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,Ly);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar1 = std::cout;
  *(uint *)(std::logic_error::logic_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::logic_error::logic_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar1 + -0x18)) = 0xb;
  while (t_min <= t_max) {
    local_140 = t_min;
    dVar5 = ising::counting::free_energy_density<lattice::graph>(1.0 / t_min,&lat,&inter,&field);
    poVar3 = std::ostream::_M_insert<double>(local_140);
    std::operator<<(poVar3,' ');
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    t_min = local_140 + t_step;
  }
  lattice::graph::~graph(&lat);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&field.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inter.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main() {
  int Lx, Ly; // system size
  std::vector<double> inter, field;
  double t_min, t_max, t_step;

  std::cin >> Lx >> Ly;
  auto lat = lattice::graph(lattice::basis::simple(2), lattice::unitcell::simple(2), lattice::extent(Lx, Ly));
  inter.resize(lat.num_bonds());
  for (std::size_t b = 0; b < lat.num_bonds(); ++b) std::cin >> inter[b];
  field.resize(lat.num_sites());
  for (std::size_t s = 0; s < lat.num_sites(); ++s) std::cin >> field[s];
  std::cin >> t_min >> t_max >> t_step;

  std::cout << "# Lx = " << Lx <<std::endl << "# Ly = " << Ly <<std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::counting::free_energy_density(beta, lat, inter, field);
    std::cout << t << ' ' << f << std::endl;
  }
}